

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::objectivec::FileClassPrefix_abi_cxx11_
          (string *__return_storage_ptr__,objectivec *this,FileDescriptor *file)

{
  bool bVar1;
  FileOptions *pFVar2;
  ulong uVar3;
  string *psVar4;
  undefined1 in_R9B;
  StringPiece full;
  undefined1 local_98 [8];
  string part;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *segment;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  char *local_50;
  undefined1 local_48 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  segments;
  allocator local_19;
  objectivec *local_18;
  FileDescriptor *file_local;
  string *result;
  
  local_18 = this;
  file_local = (FileDescriptor *)__return_storage_ptr__;
  pFVar2 = FileDescriptor::options((FileDescriptor *)this);
  bVar1 = FileOptions::has_objc_class_prefix(pFVar2);
  if (bVar1) {
    pFVar2 = FileDescriptor::options((FileDescriptor *)local_18);
    psVar4 = FileOptions::objc_class_prefix_abi_cxx11_(pFVar2);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar4);
  }
  else {
    bVar1 = anon_unknown_0::PrefixModeStorage::use_package_name
                      ((PrefixModeStorage *)(anonymous_namespace)::g_prefix_mode);
    if (bVar1) {
      FileDescriptor::package_abi_cxx11_((FileDescriptor *)local_18);
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        psVar4 = FileDescriptor::package_abi_cxx11_((FileDescriptor *)local_18);
        bVar1 = anon_unknown_0::PrefixModeStorage::is_package_exempted
                          ((PrefixModeStorage *)(anonymous_namespace)::g_prefix_mode,psVar4);
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)__return_storage_ptr__,"",
                     (allocator *)
                     ((long)&segments.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&segments.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
          return __return_storage_ptr__;
        }
        segments.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ = 0;
        std::__cxx11::string::string((string *)__return_storage_ptr__);
        psVar4 = FileDescriptor::package_abi_cxx11_((FileDescriptor *)local_18);
        stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
                  ((StringPiece *)&__range3,psVar4);
        full.length_ = (size_type)".";
        full.ptr_ = local_50;
        Split_abi_cxx11_((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_48,(protobuf *)__range3,full,(char *)0x1,(bool)in_R9B);
        __end3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_48);
        segment = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_48);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&segment), bVar1) {
          part.field_2._8_8_ =
               __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end3);
          anon_unknown_0::UnderscoresToCamelCase
                    ((string *)local_98,(string *)part.field_2._8_8_,true);
          uVar3 = std::__cxx11::string::empty();
          if ((uVar3 & 1) == 0) {
            uVar3 = std::__cxx11::string::empty();
            if ((uVar3 & 1) == 0) {
              std::__cxx11::string::append((char *)__return_storage_ptr__);
            }
            std::__cxx11::string::append((string *)__return_storage_ptr__);
          }
          std::__cxx11::string::~string((string *)local_98);
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end3);
        }
        uVar3 = std::__cxx11::string::empty();
        if ((uVar3 & 1) == 0) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        segments.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ = 1;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_48);
        if ((segments.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ & 1) != 0) {
          return __return_storage_ptr__;
        }
        std::__cxx11::string::~string((string *)__return_storage_ptr__);
        return __return_storage_ptr__;
      }
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FileClassPrefix(const FileDescriptor* file) {
  // Always honor the file option.
  if (file->options().has_objc_class_prefix()) {
    return file->options().objc_class_prefix();
  }

  // If package prefix isn't enabled or no package, done.
  if (!g_prefix_mode.use_package_name() || file->package().empty()) {
    return "";
  }

  // If the package is in the exceptions list, done.
  if (g_prefix_mode.is_package_exempted(file->package())) {
    return "";
  }

  // Transform the package into a prefix: use the dot segments as part,
  // camelcase each one and then join them with underscores, and add an
  // underscore at the end.
  std::string result;
  const std::vector<std::string> segments = Split(file->package(), ".", true);
  for (const auto& segment : segments) {
    const std::string part = UnderscoresToCamelCase(segment, true);
    if (part.empty()) {
      continue;
    }
    if (!result.empty()) {
      result.append("_");
    }
    result.append(part);
  }
  if (!result.empty()) {
    result.append("_");
  }
  return result;
}